

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pooling.cpp
# Opt level: O0

int __thiscall ncnn::Pooling::forward(Pooling *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  int iVar1;
  bool bVar2;
  int y;
  int iVar3;
  float *pfVar4;
  Mat *in_RDX;
  long in_RSI;
  long in_RDI;
  float fVar5;
  float val_2;
  int k_1;
  float sum_3;
  float *sptr_1;
  int j_5;
  int i_7;
  float *outptr_4;
  Mat m_2;
  int q_6;
  float val_1;
  int sx;
  int kj;
  int sy;
  int ki;
  int area;
  float sum_2;
  int sx0;
  int j_4;
  int sy0;
  int i_6;
  float *outptr_3;
  Mat m_1;
  int q_5;
  int htailpad;
  int wtailpad;
  float val;
  int k;
  float max_2;
  float *sptr;
  int j_3;
  int i_5;
  float *outptr_2;
  Mat m;
  int q_4;
  int j_2;
  int i_4;
  int gap;
  int p2;
  int p1;
  int *space_ofs;
  vector<int,_std::allocator<int>_> _space_ofs;
  int maxk;
  int outh;
  int outw;
  Mat bottom_blob_bordered;
  int iw_1;
  int ih_1;
  float sum_1;
  int wk;
  int iw1_1;
  int iw0_1;
  int j_1;
  int hk;
  int ih1_1;
  int ih0_1;
  int i_3;
  float *outptr_1;
  float *inptr_1;
  int q_3;
  int iw;
  int ih;
  float max_1;
  int iw1;
  int iw0;
  int j;
  int ih1;
  int ih0;
  int i_2;
  float *outptr;
  float *inptr;
  int q_2;
  int i_1;
  float sum;
  float *ptr_1;
  int q_1;
  int i;
  float max;
  float *ptr;
  int q;
  int size;
  size_t elemsize;
  int channels;
  int h;
  int w;
  Mat *in_stack_fffffffffffff9b0;
  Allocator *in_stack_fffffffffffff9b8;
  allocator_type *in_stack_fffffffffffff9c0;
  size_type in_stack_fffffffffffff9c8;
  int iVar6;
  Mat *in_stack_fffffffffffff9d0;
  Mat *in_stack_fffffffffffff9d8;
  int local_578;
  float local_574;
  int local_568;
  int local_564;
  Mat local_560;
  float *local_518;
  Option *in_stack_fffffffffffffb18;
  Mat *in_stack_fffffffffffffb20;
  Mat *in_stack_fffffffffffffb28;
  Pooling *in_stack_fffffffffffffb30;
  int local_4c8;
  int local_4bc;
  int local_4b4;
  int local_4b0;
  float local_4ac;
  int local_4a4;
  int local_49c;
  Mat local_498;
  float *local_450;
  Mat local_448;
  int local_400;
  int local_3fc;
  int local_3f8;
  float local_3f4;
  int local_3f0;
  float local_3ec;
  float *local_3e8;
  int local_3e0;
  int local_3dc;
  Mat local_3d8;
  float *local_390;
  Mat local_388;
  int local_340;
  int local_33c;
  int local_338;
  int local_334;
  int local_330;
  int local_32c;
  reference local_328;
  vector<int,_std::allocator<int>_> local_318;
  int local_300;
  int local_2fc;
  int local_2f8;
  undefined4 local_2f4;
  Mat local_2f0;
  int local_2a4;
  int local_2a0;
  float local_29c;
  int local_298;
  int local_294;
  int local_290;
  int local_28c;
  int local_288;
  int local_284;
  int local_280;
  int local_27c;
  Mat local_278;
  float *local_230;
  Mat local_228;
  float *local_1e0;
  int local_1d8;
  int local_1d4;
  int local_1d0;
  float local_1cc;
  int local_1c8;
  int local_1c4;
  int local_1c0;
  int local_1bc;
  int local_1b8;
  int local_1b4;
  Mat local_1b0;
  float *local_168;
  Mat local_160;
  float *local_118;
  int local_10c;
  int local_108;
  float local_104;
  Mat local_100;
  float *local_b8;
  int local_b0;
  int local_ac;
  float local_a8 [4];
  Mat local_98;
  float *local_50;
  int local_48;
  int local_44;
  undefined8 local_40;
  int local_34;
  int local_30;
  int local_2c;
  Mat *local_20;
  long local_18;
  int local_4;
  
  local_2c = *(int *)(in_RSI + 0x2c);
  local_30 = *(int *)(in_RSI + 0x30);
  local_34 = *(int *)(in_RSI + 0x38);
  local_40 = *(undefined8 *)(in_RSI + 0x10);
  iVar6 = (int)(in_stack_fffffffffffff9c8 >> 0x20);
  if (*(int *)(in_RDI + 0xf4) == 0) {
    if (*(int *)(in_RDI + 0x100) == 0) {
      local_18 = in_RSI;
      ncnn::Mat::Mat(&local_2f0);
      make_padding(in_stack_fffffffffffffb30,in_stack_fffffffffffffb28,in_stack_fffffffffffffb20,
                   in_stack_fffffffffffffb18);
      bVar2 = ncnn::Mat::empty(in_stack_fffffffffffff9b0);
      if (bVar2) {
        local_4 = -100;
        local_2f4 = 1;
      }
      else {
        local_2c = local_2f0.w;
        local_30 = local_2f0.h;
        local_2f8 = (local_2f0.w - *(int *)(in_RDI + 0xd4)) / *(int *)(in_RDI + 0xdc) + 1;
        local_2fc = (local_2f0.h - *(int *)(in_RDI + 0xd8)) / *(int *)(in_RDI + 0xe0) + 1;
        ncnn::Mat::create(in_stack_fffffffffffff9d0,(int)(in_stack_fffffffffffff9c8 >> 0x20),
                          (int)in_stack_fffffffffffff9c8,
                          (int)((ulong)in_stack_fffffffffffff9c0 >> 0x20),
                          (size_t)in_stack_fffffffffffff9b8,(Allocator *)in_stack_fffffffffffff9b0);
        bVar2 = ncnn::Mat::empty(in_stack_fffffffffffff9b0);
        if (bVar2) {
          local_4 = -100;
          local_2f4 = 1;
        }
        else {
          local_300 = *(int *)(in_RDI + 0xd4) * *(int *)(in_RDI + 0xd8);
          std::allocator<int>::allocator((allocator<int> *)0x4ef963);
          std::vector<int,_std::allocator<int>_>::vector
                    ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffff9d0,
                     in_stack_fffffffffffff9c8,in_stack_fffffffffffff9c0);
          std::allocator<int>::~allocator((allocator<int> *)0x4ef989);
          local_328 = std::vector<int,_std::allocator<int>_>::operator[](&local_318,0);
          local_32c = 0;
          local_330 = 0;
          local_334 = local_2c - *(int *)(in_RDI + 0xd4);
          for (local_338 = 0; local_338 < *(int *)(in_RDI + 0xd8); local_338 = local_338 + 1) {
            for (local_33c = 0; local_33c < *(int *)(in_RDI + 0xd4); local_33c = local_33c + 1) {
              local_328[local_32c] = local_330;
              local_32c = local_32c + 1;
              local_330 = local_330 + 1;
            }
            local_330 = local_334 + local_330;
          }
          if (*(int *)(in_RDI + 0xd0) == 0) {
            for (local_340 = 0; local_340 < local_34; local_340 = local_340 + 1) {
              ncnn::Mat::channel(in_stack_fffffffffffff9d8,
                                 (int)((ulong)in_stack_fffffffffffff9d0 >> 0x20));
              ncnn::Mat::channel(in_stack_fffffffffffff9d8,
                                 (int)((ulong)in_stack_fffffffffffff9d0 >> 0x20));
              pfVar4 = ncnn::Mat::operator_cast_to_float_(&local_3d8);
              ncnn::Mat::~Mat((Mat *)0x4efb4d);
              local_390 = pfVar4;
              for (local_3dc = 0; local_3dc < local_2fc; local_3dc = local_3dc + 1) {
                for (local_3e0 = 0; local_3e0 < local_2f8; local_3e0 = local_3e0 + 1) {
                  in_stack_fffffffffffff9d8 =
                       (Mat *)ncnn::Mat::row(&local_388,local_3dc * *(int *)(in_RDI + 0xe0));
                  local_3e8 = (float *)((long)&in_stack_fffffffffffff9d8->data +
                                       (long)(local_3e0 * *(int *)(in_RDI + 0xdc)) * 4);
                  local_3ec = *local_3e8;
                  for (local_3f0 = 0; local_3f0 < local_300; local_3f0 = local_3f0 + 1) {
                    local_3f4 = local_3e8[local_328[local_3f0]];
                    in_stack_fffffffffffff9d0 = (Mat *)std::max<float>(&local_3ec,&local_3f4);
                    local_3ec = *(float *)&in_stack_fffffffffffff9d0->data;
                  }
                  local_390[local_3e0] = local_3ec;
                }
                local_390 = local_390 + local_2f8;
              }
              ncnn::Mat::~Mat((Mat *)0x4efd60);
            }
          }
          else if (*(int *)(in_RDI + 0xd0) == 1) {
            if (*(int *)(in_RDI + 0xfc) == 0) {
              local_3f8 = 0;
              local_3fc = 0;
              if (*(int *)(in_RDI + 0xf8) == 0) {
                local_3f8 = ((local_2f0.w - *(int *)(local_18 + 0x2c)) - *(int *)(in_RDI + 0xe4)) -
                            *(int *)(in_RDI + 0xe8);
                local_3fc = ((local_2f0.h - *(int *)(local_18 + 0x30)) - *(int *)(in_RDI + 0xec)) -
                            *(int *)(in_RDI + 0xf0);
              }
              for (local_400 = 0; local_400 < local_34; local_400 = local_400 + 1) {
                ncnn::Mat::channel(in_stack_fffffffffffff9d8,
                                   (int)((ulong)in_stack_fffffffffffff9d0 >> 0x20));
                ncnn::Mat::channel(in_stack_fffffffffffff9d8,
                                   (int)((ulong)in_stack_fffffffffffff9d0 >> 0x20));
                pfVar4 = ncnn::Mat::operator_cast_to_float_(&local_498);
                ncnn::Mat::~Mat((Mat *)0x4efeac);
                local_450 = pfVar4;
                for (local_49c = 0; local_49c < local_2fc; local_49c = local_49c + 1) {
                  iVar6 = *(int *)(in_RDI + 0xe0);
                  for (local_4a4 = 0; local_4a4 < local_2f8; local_4a4 = local_4a4 + 1) {
                    iVar1 = *(int *)(in_RDI + 0xdc);
                    local_4ac = 0.0;
                    local_4b0 = 0;
                    for (local_4b4 = 0; local_4b4 < *(int *)(in_RDI + 0xd8);
                        local_4b4 = local_4b4 + 1) {
                      y = local_49c * iVar6 + local_4b4;
                      if (*(int *)(in_RDI + 0xec) <= y) {
                        if ((local_30 - *(int *)(in_RDI + 0xf0)) - local_3fc <= y) break;
                        for (local_4bc = 0; local_4bc < *(int *)(in_RDI + 0xd4);
                            local_4bc = local_4bc + 1) {
                          iVar3 = local_4a4 * iVar1 + local_4bc;
                          if (*(int *)(in_RDI + 0xe4) <= iVar3) {
                            if ((local_2c - *(int *)(in_RDI + 0xe8)) - local_3f8 <= iVar3) break;
                            in_stack_fffffffffffff9c0 =
                                 (allocator_type *)ncnn::Mat::row(&local_448,y);
                            local_4ac = *(float *)(in_stack_fffffffffffff9c0 + (long)iVar3 * 4) +
                                        local_4ac;
                            local_4b0 = local_4b0 + 1;
                          }
                        }
                      }
                    }
                    local_450[local_4a4] = local_4ac / (float)local_4b0;
                  }
                  local_450 = local_450 + local_2f8;
                }
                ncnn::Mat::~Mat((Mat *)0x4f019f);
              }
            }
            else {
              for (local_4c8 = 0; local_4c8 < local_34; local_4c8 = local_4c8 + 1) {
                ncnn::Mat::channel(in_stack_fffffffffffff9d8,
                                   (int)((ulong)in_stack_fffffffffffff9d0 >> 0x20));
                ncnn::Mat::channel(in_stack_fffffffffffff9d8,
                                   (int)((ulong)in_stack_fffffffffffff9d0 >> 0x20));
                pfVar4 = ncnn::Mat::operator_cast_to_float_(&local_560);
                ncnn::Mat::~Mat((Mat *)0x4f0248);
                local_518 = pfVar4;
                for (local_564 = 0; local_564 < local_2fc; local_564 = local_564 + 1) {
                  for (local_568 = 0; local_568 < local_2f8; local_568 = local_568 + 1) {
                    pfVar4 = ncnn::Mat::row((Mat *)&stack0xfffffffffffffaf0,
                                            local_564 * *(int *)(in_RDI + 0xe0));
                    local_574 = 0.0;
                    for (local_578 = 0; local_578 < local_300; local_578 = local_578 + 1) {
                      local_574 = pfVar4[(long)(local_568 * *(int *)(in_RDI + 0xdc)) +
                                         (long)local_328[local_578]] + local_574;
                    }
                    local_518[local_568] = local_574 / (float)local_300;
                  }
                  local_518 = local_518 + local_2f8;
                }
                ncnn::Mat::~Mat((Mat *)0x4f0433);
              }
            }
          }
          local_4 = 0;
          local_2f4 = 1;
          std::vector<int,_std::allocator<int>_>::~vector
                    ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffff9c0);
        }
      }
      ncnn::Mat::~Mat((Mat *)0x4f049f);
    }
    else {
      ncnn::Mat::create(in_stack_fffffffffffff9d0,iVar6,(int)in_stack_fffffffffffff9c8,
                        (int)((ulong)in_stack_fffffffffffff9c0 >> 0x20),
                        (size_t)in_stack_fffffffffffff9b8,(Allocator *)in_stack_fffffffffffff9b0);
      bVar2 = ncnn::Mat::empty(in_stack_fffffffffffff9b0);
      if (bVar2) {
        local_4 = -100;
      }
      else {
        if (*(int *)(in_RDI + 0xd0) == 0) {
          for (local_10c = 0; local_10c < local_34; local_10c = local_10c + 1) {
            ncnn::Mat::channel(in_stack_fffffffffffff9d8,
                               (int)((ulong)in_stack_fffffffffffff9d0 >> 0x20));
            pfVar4 = ncnn::Mat::operator_cast_to_float_(&local_160);
            ncnn::Mat::~Mat((Mat *)0x4ef122);
            local_118 = pfVar4;
            ncnn::Mat::channel(in_stack_fffffffffffff9d8,
                               (int)((ulong)in_stack_fffffffffffff9d0 >> 0x20));
            pfVar4 = ncnn::Mat::operator_cast_to_float_(&local_1b0);
            ncnn::Mat::~Mat((Mat *)0x4ef17a);
            local_168 = pfVar4;
            for (local_1b4 = 0; local_1b4 < *(int *)(in_RDI + 0x108); local_1b4 = local_1b4 + 1) {
              local_1b8 = (local_30 * local_1b4) / *(int *)(in_RDI + 0x108);
              local_1bc = (local_30 * (local_1b4 + 1) + *(int *)(in_RDI + 0x108) + -1) /
                          *(int *)(in_RDI + 0x108);
              for (local_1c0 = 0; local_1c0 < *(int *)(in_RDI + 0x104); local_1c0 = local_1c0 + 1) {
                local_1c4 = (local_2c * local_1c0) / *(int *)(in_RDI + 0x104);
                local_1c8 = (local_2c * (local_1c0 + 1) + *(int *)(in_RDI + 0x104) + -1) /
                            *(int *)(in_RDI + 0x104);
                local_1cc = local_118[local_1b8 * local_2c + local_1c4];
                for (local_1d0 = local_1b8; local_1d0 < local_1bc; local_1d0 = local_1d0 + 1) {
                  for (local_1d4 = local_1c4; local_1d4 < local_1c8; local_1d4 = local_1d4 + 1) {
                    pfVar4 = std::max<float>(&local_1cc,
                                             local_118 + (local_1d0 * local_2c + local_1d4));
                    local_1cc = *pfVar4;
                  }
                }
                local_168[local_1c0] = local_1cc;
              }
              local_168 = local_168 + *(int *)(in_RDI + 0x104);
            }
          }
        }
        else if (*(int *)(in_RDI + 0xd0) == 1) {
          for (local_1d8 = 0; local_1d8 < local_34; local_1d8 = local_1d8 + 1) {
            ncnn::Mat::channel(in_stack_fffffffffffff9d8,
                               (int)((ulong)in_stack_fffffffffffff9d0 >> 0x20));
            pfVar4 = ncnn::Mat::operator_cast_to_float_(&local_228);
            ncnn::Mat::~Mat((Mat *)0x4ef4a3);
            local_1e0 = pfVar4;
            ncnn::Mat::channel(in_stack_fffffffffffff9d8,
                               (int)((ulong)in_stack_fffffffffffff9d0 >> 0x20));
            pfVar4 = ncnn::Mat::operator_cast_to_float_(&local_278);
            ncnn::Mat::~Mat((Mat *)0x4ef4ef);
            local_230 = pfVar4;
            for (local_27c = 0; local_27c < *(int *)(in_RDI + 0x108); local_27c = local_27c + 1) {
              local_280 = (local_30 * local_27c) / *(int *)(in_RDI + 0x108);
              local_284 = (local_30 * (local_27c + 1) + *(int *)(in_RDI + 0x108) + -1) /
                          *(int *)(in_RDI + 0x108);
              local_288 = local_284 - local_280;
              for (local_28c = 0; local_28c < *(int *)(in_RDI + 0x104); local_28c = local_28c + 1) {
                local_290 = (local_2c * local_28c) / *(int *)(in_RDI + 0x104);
                local_294 = (local_2c * (local_28c + 1) + *(int *)(in_RDI + 0x104) + -1) /
                            *(int *)(in_RDI + 0x104);
                local_298 = local_294 - local_290;
                local_29c = 0.0;
                for (local_2a0 = local_280; iVar6 = local_290, local_2a0 < local_284;
                    local_2a0 = local_2a0 + 1) {
                  while (local_2a4 = iVar6, local_2a4 < local_294) {
                    local_29c = local_1e0[local_2a0 * local_2c + local_2a4] + local_29c;
                    iVar6 = local_2a4 + 1;
                  }
                }
                local_230[local_28c] = (local_29c / (float)local_288) / (float)local_298;
              }
              local_230 = local_230 + *(int *)(in_RDI + 0x104);
            }
          }
        }
        local_4 = 0;
      }
    }
  }
  else {
    local_20 = in_RDX;
    ncnn::Mat::create(in_stack_fffffffffffff9d0,iVar6,(size_t)in_stack_fffffffffffff9c0,
                      in_stack_fffffffffffff9b8);
    bVar2 = ncnn::Mat::empty(in_stack_fffffffffffff9b0);
    if (bVar2) {
      local_4 = -100;
    }
    else {
      local_44 = local_2c * local_30;
      if (*(int *)(in_RDI + 0xd0) == 0) {
        for (local_48 = 0; local_48 < local_34; local_48 = local_48 + 1) {
          ncnn::Mat::channel(in_stack_fffffffffffff9d8,
                             (int)((ulong)in_stack_fffffffffffff9d0 >> 0x20));
          pfVar4 = ncnn::Mat::operator_cast_to_float_(&local_98);
          ncnn::Mat::~Mat((Mat *)0x4eedbb);
          local_a8[0] = *pfVar4;
          local_50 = pfVar4;
          for (local_ac = 0; fVar5 = local_a8[0], local_ac < local_44; local_ac = local_ac + 1) {
            pfVar4 = std::max<float>(local_a8,local_50 + local_ac);
            local_a8[0] = *pfVar4;
          }
          pfVar4 = ncnn::Mat::operator[](local_20,(long)local_48);
          *pfVar4 = fVar5;
        }
      }
      else if (*(int *)(in_RDI + 0xd0) == 1) {
        for (local_b0 = 0; local_b0 < local_34; local_b0 = local_b0 + 1) {
          ncnn::Mat::channel(in_stack_fffffffffffff9d8,
                             (int)((ulong)in_stack_fffffffffffff9d0 >> 0x20));
          pfVar4 = ncnn::Mat::operator_cast_to_float_(&local_100);
          ncnn::Mat::~Mat((Mat *)0x4eef30);
          local_104 = 0.0;
          for (local_108 = 0; local_108 < local_44; local_108 = local_108 + 1) {
            local_104 = pfVar4[local_108] + local_104;
          }
          fVar5 = local_104 / (float)local_44;
          local_b8 = pfVar4;
          pfVar4 = ncnn::Mat::operator[](local_20,(long)local_b0);
          *pfVar4 = fVar5;
        }
      }
      local_4 = 0;
    }
  }
  return local_4;
}

Assistant:

int Pooling::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    // max value in NxN window
    // avg value in NxN window

    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int channels = bottom_blob.c;
    size_t elemsize = bottom_blob.elemsize;

    //     NCNN_LOGE("Pooling     input %d x %d  pad = %d %d %d %d  ksize=%d %d  stride=%d %d", w, h, pad_left, pad_right, pad_top, pad_bottom, kernel_w, kernel_h, stride_w, stride_h);
    if (global_pooling)
    {
        top_blob.create(channels, elemsize, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        int size = w * h;

        if (pooling_type == PoolMethod_MAX)
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                const float* ptr = bottom_blob.channel(q);

                float max = ptr[0];
                for (int i = 0; i < size; i++)
                {
                    max = std::max(max, ptr[i]);
                }

                top_blob[q] = max;
            }
        }
        else if (pooling_type == PoolMethod_AVE)
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                const float* ptr = bottom_blob.channel(q);

                float sum = 0.f;
                for (int i = 0; i < size; i++)
                {
                    sum += ptr[i];
                }

                top_blob[q] = sum / size;
            }
        }

        return 0;
    }

    if (adaptive_pooling)
    {
        top_blob.create(out_w, out_h, channels, elemsize, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        if (pooling_type == PoolMethod_MAX)
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                const float* inptr = bottom_blob.channel(q);
                float* outptr = top_blob.channel(q);

                for (int i = 0; i < out_h; i++)
                {
                    // floor div
                    const int ih0 = h * i / out_h;
                    // ceil div
                    const int ih1 = (h * (i + 1) + out_h - 1) / out_h;
                    for (int j = 0; j < out_w; j++)
                    {
                        // floor div
                        const int iw0 = w * j / out_w;
                        // ceil div
                        const int iw1 = (w * (j + 1) + out_w - 1) / out_w;

                        float max = inptr[ih0 * w + iw0];
                        for (int ih = ih0; ih < ih1; ih++)
                        {
                            for (int iw = iw0; iw < iw1; iw++)
                            {
                                max = std::max(max, inptr[ih * w + iw]);
                            }
                        }

                        outptr[j] = max;
                    }
                    outptr += out_w;
                }
            }
        }
        else if (pooling_type == PoolMethod_AVE)
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                const float* inptr = bottom_blob.channel(q);
                float* outptr = top_blob.channel(q);

                for (int i = 0; i < out_h; i++)
                {
                    // floor div
                    const int ih0 = h * i / out_h;
                    // ceil div
                    const int ih1 = (h * (i + 1) + out_h - 1) / out_h;
                    const int hk = ih1 - ih0;
                    for (int j = 0; j < out_w; j++)
                    {
                        // floor div
                        const int iw0 = w * j / out_w;
                        // ceil div
                        const int iw1 = (w * (j + 1) + out_w - 1) / out_w;
                        const int wk = iw1 - iw0;

                        float sum = 0;
                        for (int ih = ih0; ih < ih1; ih++)
                        {
                            for (int iw = iw0; iw < iw1; iw++)
                            {
                                sum += inptr[ih * w + iw];
                            }
                        }

                        outptr[j] = sum / hk / wk;
                    }

                    outptr += out_w;
                }
            }
        }

        return 0;
    }

    Mat bottom_blob_bordered;
    make_padding(bottom_blob, bottom_blob_bordered, opt);
    if (bottom_blob_bordered.empty())
        return -100;

    w = bottom_blob_bordered.w;
    h = bottom_blob_bordered.h;

    int outw = (w - kernel_w) / stride_w + 1;
    int outh = (h - kernel_h) / stride_h + 1;

    top_blob.create(outw, outh, channels, elemsize, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

    const int maxk = kernel_w * kernel_h;

    // kernel offsets
    std::vector<int> _space_ofs(maxk);
    int* space_ofs = &_space_ofs[0];
    {
        int p1 = 0;
        int p2 = 0;
        int gap = w - kernel_w;
        for (int i = 0; i < kernel_h; i++)
        {
            for (int j = 0; j < kernel_w; j++)
            {
                space_ofs[p1] = p2;
                p1++;
                p2++;
            }
            p2 += gap;
        }
    }

    if (pooling_type == PoolMethod_MAX)
    {
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            const Mat m = bottom_blob_bordered.channel(q);
            float* outptr = top_blob.channel(q);

            for (int i = 0; i < outh; i++)
            {
                for (int j = 0; j < outw; j++)
                {
                    const float* sptr = m.row(i * stride_h) + j * stride_w;

                    float max = sptr[0];

                    for (int k = 0; k < maxk; k++)
                    {
                        float val = sptr[space_ofs[k]];
                        max = std::max(max, val);
                    }

                    outptr[j] = max;
                }

                outptr += outw;
            }
        }
    }
    else if (pooling_type == PoolMethod_AVE)
    {
        if (avgpool_count_include_pad == 0)
        {
            int wtailpad = 0;
            int htailpad = 0;

            if (pad_mode == 0) // full padding
            {
                wtailpad = bottom_blob_bordered.w - bottom_blob.w - pad_left - pad_right;
                htailpad = bottom_blob_bordered.h - bottom_blob.h - pad_top - pad_bottom;
            }

            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                const Mat m = bottom_blob_bordered.channel(q);
                float* outptr = top_blob.channel(q);

                for (int i = 0; i < outh; i++)
                {
                    int sy0 = i * stride_h;

                    for (int j = 0; j < outw; j++)
                    {
                        int sx0 = j * stride_w;

                        float sum = 0;
                        int area = 0;

                        for (int ki = 0; ki < kernel_h; ki++)
                        {
                            int sy = sy0 + ki;

                            if (sy < pad_top)
                                continue;

                            if (sy >= h - pad_bottom - htailpad)
                                break;

                            for (int kj = 0; kj < kernel_w; kj++)
                            {
                                int sx = sx0 + kj;

                                if (sx < pad_left)
                                    continue;

                                if (sx >= w - pad_right - wtailpad)
                                    break;

                                float val = m.row(sy)[sx];
                                sum += val;
                                area += 1;
                            }
                        }

                        outptr[j] = sum / area;
                    }

                    outptr += outw;
                }
            }
        }
        else // if (avgpool_count_include_pad == 1)
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                const Mat m = bottom_blob_bordered.channel(q);
                float* outptr = top_blob.channel(q);

                for (int i = 0; i < outh; i++)
                {
                    for (int j = 0; j < outw; j++)
                    {
                        const float* sptr = m.row(i * stride_h) + j * stride_w;

                        float sum = 0;

                        for (int k = 0; k < maxk; k++)
                        {
                            float val = sptr[space_ofs[k]];
                            sum += val;
                        }

                        outptr[j] = sum / maxk;
                    }

                    outptr += outw;
                }
            }
        }
    }

    return 0;
}